

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogv.c
# Opt level: O0

_Bool ogv_start_video(ALLEGRO_VIDEO *video)

{
  long lVar1;
  ulong uVar2;
  undefined8 uVar3;
  long in_RDI;
  OGG_VIDEO *ogv;
  _Bool local_1;
  
  lVar1 = *(long *)(in_RDI + 0xf0);
  if (*(long *)(lVar1 + 0x168) == 0) {
    uVar3 = al_create_thread(decode_thread_func,in_RDI);
    *(undefined8 *)(lVar1 + 0x168) = uVar3;
    if (*(long *)(lVar1 + 0x168) == 0) {
      uVar2 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/video/ogv.c"
                               ,0x4ec,"ogv_start_video");
      if ((uVar2 & 1) != 0) {
        _al_trace_suffix("Could not create thread.\n");
      }
      local_1 = false;
    }
    else {
      al_init_user_event_source(lVar1 + 0xd0);
      uVar3 = al_create_event_queue();
      *(undefined8 *)(lVar1 + 0x150) = uVar3;
      uVar3 = al_create_mutex();
      *(undefined8 *)(lVar1 + 0x158) = uVar3;
      uVar3 = al_create_cond();
      *(undefined8 *)(lVar1 + 0x160) = uVar3;
      al_register_event_source(*(undefined8 *)(lVar1 + 0x150),lVar1 + 0xd0);
      al_start_thread(*(undefined8 *)(lVar1 + 0x168));
      local_1 = true;
    }
  }
  else {
    uVar2 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/video/ogv.c"
                             ,0x4e6,"ogv_start_video");
    if ((uVar2 & 1) != 0) {
      _al_trace_suffix("Thread already created.\n");
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool ogv_start_video(ALLEGRO_VIDEO *video)
{
   OGG_VIDEO *ogv = video->data;

   if (ogv->thread != NULL) {
      ALLEGRO_ERROR("Thread already created.\n");
      return false;
   }

   ogv->thread = al_create_thread(decode_thread_func, video);
   if (!ogv->thread) {
      ALLEGRO_ERROR("Could not create thread.\n");
      return false;
   }

   al_init_user_event_source(&ogv->evtsrc);
   ogv->queue = al_create_event_queue();
   ogv->mutex = al_create_mutex();
   ogv->cond = al_create_cond();

   al_register_event_source(ogv->queue, &ogv->evtsrc);

   al_start_thread(ogv->thread);
   return true;
}